

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_init(EditLine *el)

{
  char *pcVar1;
  funckey_t *pfVar2;
  char **ppcVar3;
  wchar_t *pwVar4;
  EditLine *el_local;
  
  pcVar1 = (char *)calloc(0x800,1);
  (el->el_terminal).t_buf = pcVar1;
  if ((el->el_terminal).t_buf != (char *)0x0) {
    pcVar1 = (char *)calloc(0x800,1);
    (el->el_terminal).t_cap = pcVar1;
    if ((el->el_terminal).t_cap != (char *)0x0) {
      pfVar2 = (funckey_t *)calloc(7,0x20);
      (el->el_terminal).t_fkey = pfVar2;
      if ((el->el_terminal).t_fkey != (funckey_t *)0x0) {
        (el->el_terminal).t_loc = 0;
        ppcVar3 = (char **)calloc(0x27,8);
        (el->el_terminal).t_str = ppcVar3;
        if ((el->el_terminal).t_str != (char **)0x0) {
          pwVar4 = (wchar_t *)calloc(8,4);
          (el->el_terminal).t_val = pwVar4;
          if ((el->el_terminal).t_val != (wchar_t *)0x0) {
            terminal_set(el,(char *)0x0);
            terminal_init_arrow(el);
            return L'\0';
          }
        }
      }
    }
    terminal_end(el);
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
terminal_init(EditLine *el)
{

	el->el_terminal.t_buf = el_calloc(TC_BUFSIZE,
	    sizeof(*el->el_terminal.t_buf));
	if (el->el_terminal.t_buf == NULL)
		return -1;
	el->el_terminal.t_cap = el_calloc(TC_BUFSIZE,
	    sizeof(*el->el_terminal.t_cap));
	if (el->el_terminal.t_cap == NULL)
		goto out;
	el->el_terminal.t_fkey = el_calloc(A_K_NKEYS,
	    sizeof(*el->el_terminal.t_fkey));
	if (el->el_terminal.t_fkey == NULL)
		goto out;
	el->el_terminal.t_loc = 0;
	el->el_terminal.t_str = el_calloc(T_str,
	    sizeof(*el->el_terminal.t_str));
	if (el->el_terminal.t_str == NULL)
		goto out;
	el->el_terminal.t_val = el_calloc(T_val,
	    sizeof(*el->el_terminal.t_val));
	if (el->el_terminal.t_val == NULL)
		goto out;
	(void) terminal_set(el, NULL);
	terminal_init_arrow(el);
	return 0;
out:
	terminal_end(el);
	return -1;
}